

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Tracks::AddTrack(Tracks *this,Track *track,int32_t number)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  Track **ppTVar6;
  uint local_44;
  uint32_t i_2;
  bool exit;
  uint32_t i_1;
  Track **track_entries;
  uint32_t count;
  uint32_t i;
  uint32_t track_num;
  int32_t number_local;
  Track *track_local;
  Tracks *this_local;
  
  if ((number < 0) || ((this->wrote_tracks_ & 1U) != 0)) {
    this_local._7_1_ = false;
  }
  else if (number < 0x7f) {
    if (number != 0) {
      for (track_entries._4_4_ = 0; track_entries._4_4_ < this->track_entries_size_;
          track_entries._4_4_ = track_entries._4_4_ + 1) {
        uVar4 = Track::number(this->track_entries_[track_entries._4_4_]);
        if (uVar4 == (uint)number) {
          return false;
        }
      }
    }
    uVar3 = this->track_entries_size_ + 1;
    uVar5 = SUB168(ZEXT416(uVar3) * ZEXT816(8),0);
    if (SUB168(ZEXT416(uVar3) * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppTVar6 = (Track **)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
    if (ppTVar6 == (Track **)0x0) {
      this_local._7_1_ = false;
    }
    else {
      for (i_2 = 0; i_2 < this->track_entries_size_; i_2 = i_2 + 1) {
        ppTVar6[i_2] = this->track_entries_[i_2];
      }
      if (this->track_entries_ != (Track **)0x0) {
        operator_delete__(this->track_entries_);
      }
      count = uVar3;
      uVar2 = number;
      if (number == 0) {
        do {
          bVar1 = true;
          for (local_44 = 0; local_44 < this->track_entries_size_; local_44 = local_44 + 1) {
            uVar4 = Track::number(ppTVar6[local_44]);
            if (uVar4 == count) {
              count = count + 1;
              bVar1 = false;
              break;
            }
          }
          uVar2 = count;
        } while (!bVar1);
      }
      count = uVar2;
      Track::set_number(track,(ulong)count);
      this->track_entries_ = ppTVar6;
      this->track_entries_[this->track_entries_size_] = track;
      this->track_entries_size_ = uVar3;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Tracks::AddTrack(Track* track, int32_t number) {
  if (number < 0 || wrote_tracks_)
    return false;

  // This muxer only supports track numbers in the range [1, 126], in
  // order to be able (to use Matroska integer representation) to
  // serialize the block header (of which the track number is a part)
  // for a frame using exactly 4 bytes.

  if (number > 0x7E)
    return false;

  uint32_t track_num = number;

  if (track_num > 0) {
    // Check to make sure a track does not already have |track_num|.
    for (uint32_t i = 0; i < track_entries_size_; ++i) {
      if (track_entries_[i]->number() == track_num)
        return false;
    }
  }

  const uint32_t count = track_entries_size_ + 1;

  Track** const track_entries = new (std::nothrow) Track*[count];  // NOLINT
  if (!track_entries)
    return false;

  for (uint32_t i = 0; i < track_entries_size_; ++i) {
    track_entries[i] = track_entries_[i];
  }

  delete[] track_entries_;

  // Find the lowest availible track number > 0.
  if (track_num == 0) {
    track_num = count;

    // Check to make sure a track does not already have |track_num|.
    bool exit = false;
    do {
      exit = true;
      for (uint32_t i = 0; i < track_entries_size_; ++i) {
        if (track_entries[i]->number() == track_num) {
          track_num++;
          exit = false;
          break;
        }
      }
    } while (!exit);
  }
  track->set_number(track_num);

  track_entries_ = track_entries;
  track_entries_[track_entries_size_] = track;
  track_entries_size_ = count;
  return true;
}